

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

Vector<double,_std::allocator<double>_> * __thiscall
amrex::MLCellLinOp::getSolvabilityOffset(MLCellLinOp *this,int amrlev,int mglev,Any *a_rhs)

{
  double dVar1;
  int iVar2;
  FabFactory<amrex::FArrayBox> *pFVar3;
  double *pdVar4;
  long *in_RSI;
  Vector<double,_std::allocator<double>_> *in_RDI;
  Real RVar5;
  MLCellLinOp *in_stack_00000010;
  int c_1;
  int c;
  MultiFab *vfrac;
  EBFArrayBoxFactory *factory;
  MultiFab *in_stack_00000088;
  int ncomp;
  MultiFab *rhs;
  Vector<double,_std::allocator<double>_> *offset;
  int in_stack_000000c8;
  int in_stack_000000cc;
  MultiFab *in_stack_000000d0;
  int in_stack_000000dc;
  MultiFab *in_stack_000000e0;
  MPI_Comm in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  MLLinOp *in_stack_ffffffffffffff40;
  long local_90;
  Any *in_stack_ffffffffffffff78;
  int local_58;
  int local_54;
  
  Any::get<amrex::MultiFab>(in_stack_ffffffffffffff78);
  computeVolInv(in_stack_00000010);
  iVar2 = (**(code **)(*in_RSI + 0x28))();
  std::allocator<double>::allocator((allocator<double> *)0x1293912);
  Vector<double,_std::allocator<double>_>::vector
            ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40,
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (allocator_type *)0x1293926);
  std::allocator<double>::~allocator((allocator<double> *)0x1293935);
  pFVar3 = MLLinOp::Factory(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                            in_stack_ffffffffffffff38);
  if (pFVar3 == (FabFactory<amrex::FArrayBox> *)0x0) {
    local_90 = 0;
  }
  else {
    local_90 = __dynamic_cast(pFVar3,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo,0);
  }
  if (local_90 == 0) {
    for (local_58 = 0; local_58 < iVar2; local_58 = local_58 + 1) {
      RVar5 = MultiFab::sum(in_stack_00000088,factory._4_4_,factory._3_1_);
      Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
      ::operator[]((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                    *)in_stack_ffffffffffffff40,
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40,
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      dVar1 = *pdVar4;
      pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40,
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      *pdVar4 = RVar5 * dVar1;
    }
  }
  else {
    EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffff40);
    for (local_54 = 0; local_54 < iVar2; local_54 = local_54 + 1) {
      in_stack_ffffffffffffff38 = 1;
      RVar5 = MultiFab::Dot(in_stack_000000e0,in_stack_000000dc,in_stack_000000d0,in_stack_000000cc,
                            in_stack_000000c8,offset._4_4_,offset._3_1_);
      Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
      ::operator[]((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                    *)in_stack_ffffffffffffff40,
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40,
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      dVar1 = *pdVar4;
      pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40,
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      *pdVar4 = RVar5 * dVar1;
    }
  }
  pdVar4 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x1293b53);
  ParallelContext::CommunicatorSub();
  ParallelAllReduce::Sum<double>(pdVar4,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
  return in_RDI;
}

Assistant:

Vector<Real>
MLCellLinOp::getSolvabilityOffset (int amrlev, int mglev, Any const& a_rhs) const
{
    AMREX_ASSERT(a_rhs.is<MultiFab>());
    auto const& rhs = a_rhs.get<MultiFab>();

    computeVolInv();

    const int ncomp = getNComp();
    Vector<Real> offset(ncomp);

#ifdef AMREX_USE_EB
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(Factory(amrlev,mglev));
    if (factory)
    {
        const MultiFab& vfrac = factory->getVolFrac();
        for (int c = 0; c < ncomp; ++c) {
            offset[c] = MultiFab::Dot(rhs, c, vfrac, 0, 1, 0, true) * m_volinv[amrlev][mglev];
        }
    }
    else
#endif
    {
        for (int c = 0; c < ncomp; ++c) {
            offset[c] = rhs.sum(c,true) * m_volinv[amrlev][mglev];
        }
    }

    ParallelAllReduce::Sum(offset.data(), ncomp, ParallelContext::CommunicatorSub());

    return offset;
}